

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

int Mf_SetAddCut(Mf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  Mf_Cut_t *pMVar1;
  Mf_Cut_t *pMVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  if (nCuts == 0) {
    return 1;
  }
  lVar9 = (long)nCuts;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < nCuts) {
    uVar8 = (ulong)(uint)nCuts;
  }
  bVar3 = false;
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    pMVar1 = pCuts[lVar9];
    pMVar2 = pCuts[uVar7];
    if ((*(uint *)&pMVar1->field_0x10 >> 0x1b < *(uint *)&pMVar2->field_0x10 >> 0x1b) &&
       ((pMVar1->Sign & ~pMVar2->Sign) == 0)) {
      iVar4 = Mf_SetCutIsContainedOrder(pMVar2,pMVar1);
      if (iVar4 != 0) {
        *(uint *)&pCuts[uVar7]->field_0x10 = *(uint *)&pCuts[uVar7]->field_0x10 | 0xf8000000;
        bVar3 = true;
      }
    }
  }
  if (bVar3) {
    lVar6 = -1;
    if (-1 < lVar9) {
      lVar6 = lVar9;
    }
    iVar4 = 0;
    for (lVar9 = 0; lVar6 + 1 != lVar9; lVar9 = lVar9 + 1) {
      if (*(uint *)&pCuts[lVar9]->field_0x10 < 0xf8000000) {
        lVar5 = (long)iVar4;
        if (lVar5 < lVar9) {
          pMVar1 = pCuts[lVar5];
          pCuts[lVar5] = pCuts[lVar9];
          pCuts[lVar9] = pMVar1;
        }
        iVar4 = iVar4 + 1;
      }
    }
    nCuts = iVar4 - 1;
  }
  for (uVar7 = (ulong)(uint)nCuts; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
    pMVar1 = pCuts[uVar7 - 1];
    pMVar2 = pCuts[uVar7];
    if (pMVar1->Flow < pMVar2->Flow) break;
    if (pMVar1->Flow <= pMVar2->Flow) {
      if ((pMVar1->Delay < pMVar2->Delay) ||
         ((pMVar1->Delay <= pMVar2->Delay &&
          (*(uint *)&pMVar1->field_0x10 >> 0x1b < *(uint *)&pMVar2->field_0x10 >> 0x1b)))) break;
    }
    pCuts[uVar7 - 1] = pMVar2;
    pCuts[uVar7] = pMVar1;
  }
  iVar4 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar4 = nCuts + 1U;
  }
  return iVar4;
}

Assistant:

static inline int Mf_SetAddCut( Mf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Mf_SetLastCutContainsArea(pCuts, nCuts);
    Mf_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}